

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmpseq.c
# Opt level: O0

sd_lookup_t * sd_find_seq(char *str,int use_header)

{
  void *__s1;
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  size_t sVar5;
  byte *local_48;
  uchar *_hj_key;
  uint local_38;
  uint _hj_k;
  uint _hj_j;
  uint _hj_i;
  uint _hf_hashv;
  uint _hf_bkt;
  sd_lookup_t *s;
  int use_header_local;
  char *str_local;
  
  __hf_hashv = (char *)0x0;
  if (sd_lookup != (sd_lookup_t *)0x0) {
    _hj_j = 0xfeedbeef;
    local_38 = 0x9e3779b9;
    _hj_k = 0x9e3779b9;
    sVar5 = strlen(str);
    local_48 = (byte *)str;
    for (_hj_key._4_4_ = (uint)sVar5; 0xb < _hj_key._4_4_; _hj_key._4_4_ = _hj_key._4_4_ - 0xc) {
      iVar1 = (uint)local_48[4] + (uint)local_48[5] * 0x100 + (uint)local_48[6] * 0x10000 +
              (uint)local_48[7] * 0x1000000 + local_38;
      uVar2 = (uint)local_48[8] + (uint)local_48[9] * 0x100 + (uint)local_48[10] * 0x10000 +
              (uint)local_48[0xb] * 0x1000000 + _hj_j;
      uVar3 = uVar2 >> 0xd ^
              (((uint)*local_48 + (uint)local_48[1] * 0x100 + (uint)local_48[2] * 0x10000 +
                (uint)local_48[3] * 0x1000000 + _hj_k) - iVar1) - uVar2;
      uVar4 = uVar3 << 8 ^ (iVar1 - uVar2) - uVar3;
      uVar2 = uVar4 >> 0xd ^ (uVar2 - uVar3) - uVar4;
      uVar3 = uVar2 >> 0xc ^ (uVar3 - uVar4) - uVar2;
      uVar4 = uVar3 << 0x10 ^ (uVar4 - uVar2) - uVar3;
      uVar2 = uVar4 >> 5 ^ (uVar2 - uVar3) - uVar4;
      _hj_k = uVar2 >> 3 ^ (uVar3 - uVar4) - uVar2;
      local_38 = _hj_k << 10 ^ (uVar4 - uVar2) - _hj_k;
      _hj_j = local_38 >> 0xf ^ (uVar2 - _hj_k) - local_38;
      local_48 = local_48 + 0xc;
    }
    sVar5 = strlen(str);
    _hj_j = _hj_j + (int)sVar5;
    switch(_hj_key._4_4_) {
    case 0xb:
      _hj_j = (uint)local_48[10] * 0x1000000 + _hj_j;
    case 10:
      _hj_j = (uint)local_48[9] * 0x10000 + _hj_j;
    case 9:
      _hj_j = (uint)local_48[8] * 0x100 + _hj_j;
    case 8:
      local_38 = (uint)local_48[7] * 0x1000000 + local_38;
    case 7:
      local_38 = (uint)local_48[6] * 0x10000 + local_38;
    case 6:
      local_38 = (uint)local_48[5] * 0x100 + local_38;
    case 5:
      local_38 = local_48[4] + local_38;
    case 4:
      _hj_k = (uint)local_48[3] * 0x1000000 + _hj_k;
    case 3:
      _hj_k = (uint)local_48[2] * 0x10000 + _hj_k;
    case 2:
      _hj_k = (uint)local_48[1] * 0x100 + _hj_k;
    case 1:
      _hj_k = *local_48 + _hj_k;
    default:
      uVar2 = _hj_j >> 0xd ^ (_hj_k - local_38) - _hj_j;
      uVar3 = uVar2 << 8 ^ (local_38 - _hj_j) - uVar2;
      uVar4 = uVar3 >> 0xd ^ (_hj_j - uVar2) - uVar3;
      uVar2 = uVar4 >> 0xc ^ (uVar2 - uVar3) - uVar4;
      uVar3 = uVar2 << 0x10 ^ (uVar3 - uVar4) - uVar2;
      uVar4 = uVar3 >> 5 ^ (uVar4 - uVar2) - uVar3;
      uVar2 = uVar4 >> 3 ^ (uVar2 - uVar3) - uVar4;
      uVar3 = uVar2 << 10 ^ (uVar3 - uVar4) - uVar2;
      uVar2 = (uVar3 >> 0xf ^ (uVar4 - uVar2) - uVar3) & ((sd_lookup->hh).tbl)->num_buckets - 1;
      if (((sd_lookup->hh).tbl)->buckets[uVar2].hh_head == (UT_hash_handle *)0x0) {
        __hf_hashv = (char *)0x0;
      }
      else {
        __hf_hashv = (char *)((long)((sd_lookup->hh).tbl)->buckets[uVar2].hh_head -
                             ((sd_lookup->hh).tbl)->hho);
      }
    }
    while (__hf_hashv != (char *)0x0) {
      uVar2 = *(uint *)(__hf_hashv + 0x58);
      sVar5 = strlen(str);
      if (uVar2 == sVar5) {
        __s1 = *(void **)(__hf_hashv + 0x50);
        sVar5 = strlen(str);
        iVar1 = memcmp(__s1,str,sVar5);
        if (iVar1 == 0) break;
      }
      if (*(long *)(__hf_hashv + 0x48) == 0) {
        __hf_hashv = (char *)0x0;
      }
      else {
        __hf_hashv = (char *)(*(long *)(__hf_hashv + 0x48) - ((sd_lookup->hh).tbl)->hho);
      }
    }
  }
  if (__hf_hashv == (char *)0x0) {
    str_local = (char *)0x0;
  }
  else {
    str_local = __hf_hashv;
  }
  return (sd_lookup_t *)str_local;
}

Assistant:

sd_lookup_t *sd_find_seq(char *str, int use_header)
{
	sd_lookup_t *s;
	HASH_FIND_STR(sd_lookup, str, s);
	if (s)
		return s;
	else
		return (sd_lookup_t *)NULL;
}